

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

HelicsFilter
helicsFederateRegisterGlobalFilter
          (HelicsFederate fed,HelicsFilterTypes type,char *name,HelicsError *err)

{
  bool bVar1;
  element_type *this;
  Filter *pFVar2;
  pointer pFVar3;
  long in_RDX;
  int in_ESI;
  Federate *in_stack_00000060;
  FilterTypes in_stack_00000068;
  InterfaceVisibility in_stack_0000006c;
  string_view in_stack_00000070;
  __single_object filt;
  shared_ptr<helics::Federate> fedObj;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  shared_ptr<helics::Federate> *this_00;
  HelicsError *in_stack_ffffffffffffff30;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *this_01;
  HelicsFederate in_stack_ffffffffffffff38;
  allocator<char> *__a;
  undefined4 in_stack_ffffffffffffff58;
  int iVar4;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> local_98;
  byte local_8a;
  allocator<char> local_89;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
  *in_stack_ffffffffffffff78;
  HelicsFederate in_stack_ffffffffffffff80;
  shared_ptr<helics::Federate> local_48;
  __shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> local_38;
  long local_20;
  int local_14;
  HelicsFilter local_8;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  getFedSharedPtr(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_38);
  if (bVar1) {
    std::make_unique<helics::FilterObject>();
    iVar4 = local_14;
    this = std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::get(&local_38);
    local_8a = 0;
    if (local_20 == 0) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_ffffffffffffff58));
    }
    else {
      __a = &local_89;
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)CONCAT44(iVar4,in_stack_ffffffffffffff58),__a);
    }
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
    pFVar2 = helics::make_filter(in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                                 in_stack_00000070);
    pFVar3 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e58f4);
    pFVar3->filtPtr = pFVar2;
    std::__cxx11::string::~string(in_stack_ffffffffffffff20);
    if ((local_8a & 1) != 0) {
      std::allocator<char>::~allocator(&local_89);
    }
    this_00 = &local_48;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::operator->
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               0x1e592c);
    std::shared_ptr<helics::Federate>::operator=
              (this_00,(shared_ptr<helics::Federate> *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    pFVar3 = std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::
             operator->((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                         *)0x1e5955);
    pFVar3->custom = local_14 == 0;
    this_01 = &local_98;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::unique_ptr
              ((unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> *)
               this_00,(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                        *)CONCAT44(local_14,in_stack_ffffffffffffff18));
    local_8 = anon_unknown.dwarf_88686::federateAddFilter
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (this_01);
    local_48.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (this_01);
  }
  else {
    local_8 = (HelicsFilter)0x0;
    local_48.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
  }
  std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1e5ac0);
  return local_8;
}

Assistant:

HelicsFilter helicsFederateRegisterGlobalFilter(HelicsFederate fed, HelicsFilterTypes type, const char* name, HelicsError* err)
{
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->filtPtr = &helics::make_filter(helics::InterfaceVisibility::GLOBAL,
                                             static_cast<helics::FilterTypes>(type),
                                             fedObj.get(),
                                             AS_STRING(name));
        filt->fedptr = std::move(fedObj);
        filt->custom = (type == HELICS_FILTER_TYPE_CUSTOM);
        return federateAddFilter(fed, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}